

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_compiled_light.cpp
# Opt level: O3

void __thiscall
randomx::CompiledLightVm<randomx::AlignedAllocator<64UL>,_true,_true>::setCache
          (CompiledLightVm<randomx::AlignedAllocator<64UL>,_true,_true> *this,randomx_cache *cache)

{
  JitCompiler *this_00;
  
  *(randomx_cache **)
   &(this->super_CompiledVm<randomx::AlignedAllocator<64UL>,_true,_true>).field_0x9f8 = cache;
  *(uint8_t **)&(this->super_CompiledVm<randomx::AlignedAllocator<64UL>,_true,_true>).field_0x9e8 =
       cache->memory;
  this_00 = &(this->super_CompiledVm<randomx::AlignedAllocator<64UL>,_true,_true>).compiler;
  JitCompilerX86::enableWriting(this_00);
  JitCompilerX86::generateSuperscalarHash<8ul>(this_00,&cache->programs,&cache->reciprocalCache);
  JitCompilerX86::enableExecution(this_00);
  return;
}

Assistant:

void CompiledLightVm<Allocator, softAes, secureJit>::setCache(randomx_cache* cache) {
		cachePtr = cache;
		mem.memory = cache->memory;
		if (secureJit) {
			compiler.enableWriting();
		}
		compiler.generateSuperscalarHash(cache->programs, cache->reciprocalCache);
		if (secureJit) {
			compiler.enableExecution();
		}
	}